

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-dtoa.cc
# Opt level: O3

void TestDtoaCorners(void)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char *pcVar4;
  bool sign;
  int length;
  int point;
  char buffer_container [100];
  int *piVar5;
  int *point_00;
  undefined8 uVar6;
  bool local_91;
  int local_90;
  int local_8c;
  short local_88 [56];
  
  point_00 = &local_8c;
  piVar5 = point_00;
  double_conversion::DoubleToStringConverter::DoubleToAscii
            (0.0,PRECISION,0,(char *)local_88,100,&local_91,&local_90,point_00);
  if (local_90 == 0) {
    if ((char)local_88[0] != '\0') {
      pcVar1 = "\"\"";
      pcVar4 = "";
      uVar2 = 0x193;
LAB_00862077:
      printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %s\n#  Found:    %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-dtoa.cc"
             ,uVar2,pcVar1,"buffer.start()",pcVar4,local_88);
      abort();
    }
    if (local_91 == true) {
      uVar2 = 0x194;
      goto LAB_0086209d;
    }
    piVar5 = point_00;
    double_conversion::DoubleToStringConverter::DoubleToAscii
              (1.0,PRECISION,0,(char *)local_88,100,&local_91,&local_90,point_00);
    if (local_90 == 0) {
      if ((char)local_88[0] != '\0') {
        pcVar1 = "\"\"";
        pcVar4 = "";
        uVar2 = 0x198;
        goto LAB_00862077;
      }
      if (local_91 == true) {
        uVar2 = 0x199;
        goto LAB_0086209d;
      }
      piVar5 = point_00;
      double_conversion::DoubleToStringConverter::DoubleToAscii
                (0.0,FIXED,0,(char *)local_88,100,&local_91,&local_90,point_00);
      if (local_90 == 1) {
        if (local_88[0] != 0x30) {
          pcVar1 = "\"0\"";
          pcVar4 = "0";
          uVar2 = 0x19d;
          goto LAB_00862077;
        }
        if (local_91 == true) {
          uVar2 = 0x19e;
LAB_0086209d:
          printf("%s:%d:\n CHECK(%s) failed\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-dtoa.cc"
                 ,uVar2,"!sign");
          abort();
        }
        double_conversion::DoubleToStringConverter::DoubleToAscii
                  (1.0,FIXED,0,(char *)local_88,100,&local_91,&local_90,point_00);
        if (local_90 == 1) {
          if (local_88[0] != 0x31) {
            pcVar1 = "\"1\"";
            pcVar4 = "1";
            uVar2 = 0x1a2;
            goto LAB_00862077;
          }
          if (local_91 != true) {
            return;
          }
          uVar2 = 0x1a3;
          goto LAB_0086209d;
        }
        uVar6 = CONCAT44((int)((ulong)point_00 >> 0x20),local_90);
        uVar2 = 0x1a1;
      }
      else {
        uVar6 = CONCAT44((int)((ulong)piVar5 >> 0x20),local_90);
        uVar2 = 0x19c;
      }
      pcVar1 = "1.0e+ 1";
      uVar3 = 1;
      goto LAB_0086203f;
    }
    uVar6 = CONCAT44((int)((ulong)piVar5 >> 0x20),local_90);
    uVar2 = 0x197;
  }
  else {
    uVar6 = CONCAT44((int)((ulong)piVar5 >> 0x20),local_90);
    uVar2 = 0x192;
  }
  pcVar1 = "0x3p+ 0";
  uVar3 = 0;
LAB_0086203f:
  printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %d\n#  Found:    %d\n",
         "/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-dtoa.cc"
         ,uVar2,pcVar1 + 6,"length",uVar3,uVar6);
  abort();
}

Assistant:

TEST(DtoaCorners) {
  char buffer_container[kBufferSize];
  Vector<char> buffer(buffer_container, kBufferSize);
  bool sign;
  int length;
  int point;

  DoubleToAscii(0.0, PRECISION, 0, buffer, &sign, &length, &point);
  CHECK_EQ(0, length);
  CHECK_EQ("", buffer.start());
  CHECK(!sign);

  DoubleToAscii(1.0, PRECISION, 0, buffer, &sign, &length, &point);
  CHECK_EQ(0, length);
  CHECK_EQ("", buffer.start());
  CHECK(!sign);

  DoubleToAscii(0.0, FIXED, 0, buffer, &sign, &length, &point);
  CHECK_EQ(1, length);
  CHECK_EQ("0", buffer.start());
  CHECK(!sign);

  DoubleToAscii(1.0, FIXED, 0, buffer, &sign, &length, &point);
  CHECK_EQ(1, length);
  CHECK_EQ("1", buffer.start());
  CHECK(!sign);
}